

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw_style.h
# Opt level: O0

void __thiscall CGL::GLScene::DrawStyle::style_vertex(DrawStyle *this)

{
  long in_RDI;
  GLfloat temp [4];
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_18 = *(undefined4 *)(in_RDI + 0xc);
  local_14 = *(undefined4 *)(in_RDI + 0x10);
  local_10 = *(undefined4 *)(in_RDI + 0x14);
  local_c = 0x3f800000;
  glColor4fv(&local_18);
  glPointSize(*(undefined4 *)(in_RDI + 0x34));
  return;
}

Assistant:

void style_vertex() const {
    GLfloat temp[4];
    temp[0] = vertexColor.r;
    temp[1] = vertexColor.g;
    temp[2] = vertexColor.b;
    temp[3] = 1.f;
    glColor4fv(temp);
    glPointSize(vertexRadius);
  }